

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

double __thiscall
ON_SubDEdgeSharpness::SharpnessFromSliderValue
          (ON_SubDEdgeSharpness *this,ON_Interval slider_domain,double slider_value,
          double invalid_input_result)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  ON_Interval ZeroToMaximumSharpness;
  ON_Interval local_40;
  double local_30;
  double local_28;
  undefined8 uStack_20;
  ON_Interval local_18;
  
  local_40.m_t[1] = slider_domain.m_t[1];
  local_40.m_t[0] = slider_domain.m_t[0];
  local_30 = invalid_input_result;
  bVar1 = ON_Interval::IsInterval(&local_40);
  if (!bVar1) {
    return local_30;
  }
  dVar3 = ON_Interval::Min(&local_40);
  if (slider_value < dVar3) {
    return local_30;
  }
  dVar3 = ON_Interval::Max(&local_40);
  if (dVar3 < slider_value) {
    return local_30;
  }
  pdVar2 = ON_Interval::operator[](&local_40,0);
  if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) {
    local_28 = 4.0;
    pdVar2 = ON_Interval::operator[](&local_40,1);
    if ((local_28 == *pdVar2) && (!NAN(local_28) && !NAN(*pdVar2))) {
      return slider_value;
    }
  }
  pdVar2 = ON_Interval::operator[](&local_40,0);
  if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) {
    pdVar2 = ON_Interval::operator[](&local_40,1);
    if ((*pdVar2 == 1.0) && (!NAN(*pdVar2))) goto LAB_005d4318;
  }
  slider_value = ON_Interval::NormalizedParameterAt(&local_40,slider_value);
LAB_005d4318:
  bVar1 = true;
  if ((0.0 <= slider_value) && (slider_value <= 1.0)) {
    local_28 = 4.0;
    uStack_20 = 0;
    ON_Interval::ON_Interval(&local_18,0.0,4.0);
    dVar3 = ON_Interval::ParameterAt(&local_18,slider_value);
    slider_value = Sanitize(dVar3,local_30);
    bVar1 = local_28 < slider_value || slider_value < 0.0;
  }
  if (bVar1) {
    return local_30;
  }
  return slider_value;
}

Assistant:

double ON_SubDEdgeSharpness::SharpnessFromSliderValue(
  ON_Interval slider_domain,
  double slider_value,
  double invalid_input_result
)
{
  if (slider_domain.IsInterval() && slider_value >= slider_domain.Min() && slider_value <= slider_domain.Max())
  {
    if (0.0 == slider_domain[0] && ON_SubDEdgeSharpness::MaximumValue == slider_domain[1])
      return slider_value;
    const double s = (0.0 == slider_domain[0] && 1.0 == slider_domain[1]) ? slider_value : slider_domain.NormalizedParameterAt(slider_value);
    if (s >= 0.0 && s <= 1.0)
    {
      const ON_Interval ZeroToMaximumSharpness(0.0, ON_SubDEdgeSharpness::MaximumValue);
      double sharpness = ON_SubDEdgeSharpness::Sanitize(ZeroToMaximumSharpness.ParameterAt(s), invalid_input_result);
      if (sharpness >= 0.0 && sharpness <= ON_SubDEdgeSharpness::MaximumValue)
        return sharpness;
    }
  }
  return invalid_input_result;
}